

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestSpec::NamePattern::~NamePattern(NamePattern *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__NamePattern_001ffc68;
  WildcardPattern::~WildcardPattern((WildcardPattern *)0x18f51a);
  Pattern::~Pattern((Pattern *)0x18f524);
  return;
}

Assistant:

TestSpec::NamePattern::~NamePattern() {}